

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall Memory::Recycler::CollectNow<(Memory::CollectionFlags)8320>(Recycler *this)

{
  CollectionState CVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  CVar1 = (this->collectionState).value;
  if ((CVar1 & (CollectionStatePostSweepRedeferralCallback|CollectionStatePostCollectionCallback))
      == CollectionStateNotCollecting) {
    if ((this->disableCollection == false) && (this->isShuttingDown != true)) {
      this->hasExhaustiveCandidate = true;
    }
    else if (((CVar1 & ~CollectionStateExit) != CollectionStateNotCollecting) &&
            (this->isShuttingDown == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe1a,
                         "(collectionState == CollectionStateNotCollecting || collectionState == CollectionStateExit || this->isShuttingDown)"
                         ,
                         "collectionState == CollectionStateNotCollecting || collectionState == CollectionStateExit || this->isShuttingDown"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  return 0;
}

Assistant:

BOOL
Recycler::CollectNow()
{
    // Force-in-thread cannot be concurrent or partial
    CompileAssert((flags & CollectOverride_ForceInThread) == 0 || (flags & (CollectMode_Concurrent | CollectMode_Partial)) == 0);

    // Collections not allowed when the recycler is currently executing the PostCollectionCallback
    if (this->IsAllocatableCallbackState())
    {
        return false;
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if ((disableCollection && (flags & CollectOverride_Explicit) == 0) || isShuttingDown)
#else
    if (isShuttingDown)
#endif
    {
        Assert(collectionState == CollectionStateNotCollecting
            || collectionState == CollectionStateExit
            || this->isShuttingDown);
        return false;
    }

    if (flags & CollectOverride_ExhaustiveCandidate)
    {
        return CollectWithExhaustiveCandidate<flags>();
    }

    return CollectInternal<flags>();
}